

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_join(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  int iVar1;
  int iVar2;
  vm_val_t *pvVar3;
  char *pcVar4;
  int *in_RCX;
  char *sep;
  int sep_len;
  uint argc;
  size_t in_stack_00000098;
  char *in_stack_000000a0;
  vm_val_t *in_stack_000000a8;
  vm_val_t *in_stack_000000b0;
  vm_val_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int n;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  iVar2 = n;
  if ((getp_join(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_join(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_join::desc,0,1);
    __cxa_guard_release(&getp_join(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,(uint *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffffa8);
  if (iVar2 == 0) {
    if ((n != 0) && (pvVar3 = CVmStack::get(0), pvVar3->typ != VM_NIL)) {
      CVmStack::get(0);
      pcVar4 = vm_val_t::get_as_string(in_stack_ffffffffffffffa8);
      if (pcVar4 == (char *)0x0) {
        err_throw(0);
      }
      vmb_get_len((char *)0x36e863);
    }
    join(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_join(VMG_ vm_val_t *retval,
                          const vm_val_t *self_val,
                          const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'separator' argument is valid */
    int sep_len = 0;
    const char *sep = 0;
    if (argc >= 1 && G_stk->get(0)->typ != VM_NIL)
    {
        /* it's there - make sure it's a string */
        if ((sep = G_stk->get(0)->get_as_string(vmg0_)) == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* note its length, and get a pointer to its string bytes */
        sep_len = vmb_get_len(sep);
        sep += VMB_LEN;
    }

    /* do the join */
    join(vmg_ retval, self_val, sep, sep_len);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}